

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XDataAllocator.cpp
# Opt level: O3

void __thiscall
Memory::XDataAllocator::Release(XDataAllocator *this,SecondaryAllocation *allocation)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  HeapAllocator *this_00;
  XDataAllocationEntry *pXVar4;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  if (allocation->address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/amd64/XDataAllocator.cpp"
                       ,0x58,"(allocation.address)","allocation.address");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  local_48 = (undefined1  [8])&XDataAllocationEntry::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_281cb75;
  data.filename._0_4_ = 0x5a;
  this_00 = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,(TrackAllocData *)local_48);
  pXVar4 = (XDataAllocationEntry *)HeapAllocator::AllocT<true>(this_00,0x10);
  (pXVar4->super_XDataAllocation).super_SecondaryAllocation.address = (BYTE *)0x0;
  (pXVar4->super_XDataAllocation).super_SecondaryAllocation.address = allocation->address;
  pXVar4->next = this->freeList;
  this->freeList = pXVar4;
  return;
}

Assistant:

void XDataAllocator::Release(const SecondaryAllocation& allocation)
{
    const XDataAllocation& xdata = static_cast<const XDataAllocation&>(allocation);
    Assert(allocation.address);
    // Add it to free list
    auto freed = HeapNewNoThrowStruct(XDataAllocationEntry);
    if(freed)
    {
        freed->address = xdata.address;
        freed->next = this->freeList;
        this->freeList = freed;
    }
}